

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TProtocol.h
# Opt level: O1

void __thiscall
duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(TProtocol *this)

{
  uint uVar1;
  undefined8 *puVar2;
  
  uVar1 = this->output_recursion_depth_ + 1;
  this->output_recursion_depth_ = uVar1;
  if (uVar1 <= this->recursion_limit_) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
  puVar2[1] = puVar2 + 3;
  puVar2[2] = 0;
  *(undefined1 *)(puVar2 + 3) = 0;
  *puVar2 = &PTR__TException_019d52c0;
  *(undefined4 *)(puVar2 + 5) = 6;
  __cxa_throw(puVar2,&TProtocolException::typeinfo,TException::~TException);
}

Assistant:

void incrementOutputRecursionDepth() {
    if (recursion_limit_ < ++output_recursion_depth_) {
      throw TProtocolException(TProtocolException::DEPTH_LIMIT);
    }
  }